

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O3

void __thiscall Apt::PostProcessPaths(Apt *this)

{
  pointer pTVar1;
  pointer pTVar2;
  _Base_ptr p_Var3;
  size_t dontCombineWith;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  int iVar7;
  double dVar8;
  size_t idxB;
  size_t idxA;
  unsigned_long local_50;
  unsigned_long local_48;
  double local_40;
  double local_38;
  
  p_Var3 = mapPos._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)mapPos._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &mapPos._M_t._M_impl.super__Rb_tree_header) {
    do {
      if ((_Base_ptr)0x1 < p_Var3[1]._M_right) {
        AddTaxiNode(this,(double)p_Var3[1]._M_left,(double)p_Var3[1]._M_parent,0xffffffffffffffff,
                    false);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != &mapPos._M_t._M_impl.super__Rb_tree_header);
  }
  if (listPaths_abi_cxx11_.super__List_base<TaxiTmpPath,_std::allocator<TaxiTmpPath>_>._M_impl.
      _M_node.super__List_node_base._M_next != (_List_node_base *)&listPaths_abi_cxx11_) {
    pTVar1 = (this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pTVar2 = (this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var5 = listPaths_abi_cxx11_.super__List_base<TaxiTmpPath,_std::allocator<TaxiTmpPath>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    do {
      local_48 = 0xffffffffffffffff;
      local_50 = 0xffffffffffffffff;
      dontCombineWith =
           AddTaxiNode(this,(double)p_Var5[1]._M_next[1]._M_prev,
                       (double)p_Var5[1]._M_next[1]._M_next,0xffffffffffffffff,true);
      local_48 = dontCombineWith;
      if (vecPathEnds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          vecPathEnds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&vecPathEnds,
                   (iterator)
                   vecPathEnds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_48);
      }
      else {
        *vecPathEnds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = dontCombineWith;
        vecPathEnds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             vecPathEnds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      p_Var6 = p_Var5[1]._M_next;
      p_Var4 = p_Var5[1]._M_prev;
      if (p_Var6 != p_Var4) {
        iVar7 = 0;
        local_40 = NAN;
        do {
          local_38 = CoordAngle((double)p_Var6[1]._M_prev,(double)p_Var6[1]._M_next,
                                (double)p_Var6->_M_next[1]._M_prev,
                                (double)p_Var6->_M_next[1]._M_next);
          if (NAN(local_40)) {
LAB_0015dcd9:
            iVar7 = 0;
            local_40 = local_38;
          }
          else {
            local_50 = GetSimilarTaxiNode(this,(double)p_Var6[1]._M_prev,(double)p_Var6[1]._M_next,
                                          0xffffffffffffffff);
            if ((3 < iVar7 || local_50 < (ulong)((long)pTVar1 - (long)pTVar2 >> 6)) ||
               (dVar8 = HeadingDiff(local_40,local_38), 15.0 < ABS(dVar8))) {
              if (local_50 == 0xffffffffffffffff) {
                local_50 = AddTaxiNode(this,(double)p_Var6[1]._M_prev,(double)p_Var6[1]._M_next,
                                       0xffffffffffffffff,false);
              }
              if (local_48 != local_50) {
                AddTaxiEdge(this,local_48,local_50,TAXI_WAY);
                local_48 = local_50;
                goto LAB_0015dcd9;
              }
            }
            else {
              iVar7 = iVar7 + 1;
            }
          }
          p_Var6 = p_Var6->_M_next;
          p_Var4 = p_Var5[1]._M_prev;
        } while (p_Var6 != p_Var4);
      }
      local_50 = AddTaxiNode(this,(double)p_Var4[1]._M_prev,(double)p_Var4[1]._M_next,
                             dontCombineWith,true);
      if (local_48 != local_50) {
        AddTaxiEdge(this,local_48,local_50,TAXI_WAY);
        if (vecPathEnds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            vecPathEnds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&vecPathEnds,
                     (iterator)
                     vecPathEnds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_50);
        }
        else {
          *vecPathEnds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = local_50;
          vecPathEnds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               vecPathEnds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
               .super__Vector_impl_data._M_finish + 1;
        }
      }
      p_Var5 = (((_List_base<TaxiTmpPath,_std::allocator<TaxiTmpPath>_> *)&p_Var5->_M_next)->_M_impl
               )._M_node.super__List_node_base._M_next;
    } while (p_Var5 != (_List_node_base *)&listPaths_abi_cxx11_);
  }
  return;
}

Assistant:

void PostProcessPaths ()
    {
        // -- 1. Identify joints and add them upfront to our network
        for (const auto& p: mapPos)
            if (p.second.isJoint())
                AddTaxiNode(p.second.lat(), p.second.lon(), ULONG_MAX, false);
        // all joints added, so up to here it is all full of joints:
        const size_t firstNonJoint = vecTaxiNodes.size();

        // -- 2. Process the edges, thereby adding more nodes
        for (const TaxiTmpPath& p: listPaths)
        {
            // The indexes to be used when adding the edge.
            // idxA points to the (already added) first node,
            // idxB to the just now added second node
            size_t idxA=ULONG_MAX, idxB=ULONG_MAX;
            
            // The first node of the entire list is definitely used, add it already
            const size_t idxA_First =
            idxA = AddTaxiNode(p.listPos.front().lat(),
                               p.listPos.front().lon());
            // Remember this node as one of the path's endpoint
            vecPathEnds.push_back(idxA);
            
            // The very last node will also be added later.
            // Between these two:
            // Combine adges til
            // a) reaching a joint, or
            // b) heading changes too much.
            // Add the remainder to the airport's taxi network
            double firstAngle = NAN;
            int numSkipped = 0;                         // number of skipped nodes in a row
            for (auto iEnd = p.listPos.cbegin();
                 iEnd != std::prev(p.listPos.cend());
                 ++iEnd)
            {
                const TaxiTmpPos& b = *iEnd;            // last node that is confirmed to be part of the edge
                const TaxiTmpPos& c = *std::next(iEnd); // next node, to be validated if still in the edge
                double bcAngle = CoordAngle(b.lat(), b.lon(), c.lat(), c.lon());
                if (std::isnan(firstAngle)) {           // new edge has just started, this is our reference angle
                    firstAngle = bcAngle;
                    numSkipped = 0;
                }
                else
                {
                    // is b a joint?
                    idxB = GetSimilarTaxiNode(b.lat(), b.lon());
                    if (idxB < firstNonJoint ||
                        // so many nodes...there's a reason for them, isn't it?
                        numSkipped >= 4 ||
                        // or has heading changed too much?
                        std::abs(HeadingDiff(firstAngle, bcAngle)) > APT_MAX_TAXI_SEGM_TURN)
                    {
                        // Add the edge to this node
                        if (idxB == ULONG_MAX)
                            idxB = AddTaxiNode(b.lat(), b.lon(), ULONG_MAX, false);
                        if (idxA != idxB) {
                            AddTaxiEdge(idxA, idxB);
                            // start a new edge, first segment will be b-c
                            idxA = idxB;
                            firstAngle = bcAngle;
                            numSkipped = 0;
                        }
                    }
                    else
                        ++numSkipped;
                }
            }
            
            // The last node of the list is also always to be added
            idxB = AddTaxiNode(p.listPos.back().lat(),
                               p.listPos.back().lon(),
                               idxA_First);     // never combine with very first node; this ensures that at least one edge will be added!
            if (idxA != idxB) {
                AddTaxiEdge(idxA, idxB);
                // Remember this node as the path's other endpoint
                vecPathEnds.push_back(idxB);
            }
        }
    }